

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<146U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<46U,_Fixpp::Type::String>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>_>_>_>
::Visitor::Visitor(Visitor *this,ParsingContext *context,GroupSet *groupSet,bool strict,
                  bool skipUnknown)

{
  bool skipUnknown_local;
  bool strict_local;
  GroupSet *groupSet_local;
  ParsingContext *context_local;
  Visitor *this_local;
  
  this->recursive = false;
  this->context = context;
  this->groupSet = groupSet;
  this->strict = strict;
  this->skipUnknown = skipUnknown;
  return;
}

Assistant:

Visitor(ParsingContext& context, GroupSet& groupSet, bool strict, bool skipUnknown)
                    : recursive(false)
                    , context(context)
                    , groupSet(groupSet)
                    , strict(strict)
                    , skipUnknown(skipUnknown)
                    
                { }